

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cost.c
# Opt level: O1

void SetResidualCoeffs_C(int16_t *coeffs,VP8Residual *res)

{
  uint uVar1;
  bool bVar2;
  
  res->last = -1;
  uVar1 = 0xf;
  do {
    if (coeffs[uVar1] != 0) {
      res->last = uVar1;
      break;
    }
    bVar2 = uVar1 != 0;
    uVar1 = uVar1 - 1;
  } while (bVar2);
  res->coeffs = coeffs;
  return;
}

Assistant:

static void SetResidualCoeffs_C(const int16_t* WEBP_RESTRICT const coeffs,
                                VP8Residual* WEBP_RESTRICT const res) {
  int n;
  res->last = -1;
  assert(res->first == 0 || coeffs[0] == 0);
  for (n = 15; n >= 0; --n) {
    if (coeffs[n]) {
      res->last = n;
      break;
    }
  }
  res->coeffs = coeffs;
}